

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# T.c
# Opt level: O0

void envy_bios_print_T_tmds_info(envy_bios *bios,FILE *out,uint mask)

{
  envy_bios_T_tmds_info *peVar1;
  envy_bios_T_tmds_info_entry *e;
  int i;
  envy_bios_T_tmds_info *tmds;
  uint mask_local;
  FILE *out_local;
  envy_bios *bios_local;
  
  peVar1 = &(bios->T).tmds_info;
  if ((peVar1->offset != 0) && ((mask & 0x800000) != 0)) {
    if ((bios->T).tmds_info.valid == '\0') {
      fprintf(_stderr,"Failed to parse TMDS INFO table at 0x%x, version %x\n\n",
              (ulong)peVar1->offset,(ulong)(bios->T).tmds_info.version);
    }
    else {
      fprintf((FILE *)out,"TMDS INFO table at 0x%x, version %x\n",(ulong)peVar1->offset,
              (ulong)(bios->T).tmds_info.version);
      envy_bios_dump_hex(bios,out,(uint)peVar1->offset,(uint)(bios->T).tmds_info.hlen,mask);
      if ((mask & 0x80000000) != 0) {
        fprintf((FILE *)out,"\n");
      }
      for (e._4_4_ = 0; e._4_4_ < (int)(uint)(bios->T).tmds_info.entriesnum; e._4_4_ = e._4_4_ + 1)
      {
        envy_bios_dump_hex(bios,out,(uint)(bios->T).tmds_info.entries[e._4_4_].offset,
                           (uint)(bios->T).tmds_info.rlen,mask);
        if ((mask & 0x80000000) != 0) {
          fprintf((FILE *)out,"\n");
        }
      }
      fprintf((FILE *)out,"\n");
    }
  }
  return;
}

Assistant:

void
envy_bios_print_T_tmds_info(struct envy_bios *bios, FILE *out, unsigned mask)
{
	struct envy_bios_T_tmds_info *tmds = &bios->T.tmds_info;
	int i;

	if (!tmds->offset || !(mask & ENVY_BIOS_PRINT_T))
		return;
	if (!tmds->valid) {
		ENVY_BIOS_ERR("Failed to parse TMDS INFO table at 0x%x, version %x\n\n", tmds->offset, tmds->version);
		return;
	}

	fprintf(out, "TMDS INFO table at 0x%x, version %x\n", tmds->offset, tmds->version);
	envy_bios_dump_hex(bios, out, tmds->offset, tmds->hlen, mask);
	if (mask & ENVY_BIOS_PRINT_VERBOSE) fprintf(out, "\n");

	for (i = 0; i < tmds->entriesnum; ++i) {
		struct envy_bios_T_tmds_info_entry *e = &tmds->entries[i];
		envy_bios_dump_hex(bios, out, e->offset, tmds->rlen, mask);
		if (mask & ENVY_BIOS_PRINT_VERBOSE) fprintf(out, "\n");
	}

	fprintf(out, "\n");
}